

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QArrayDataPointer<QueuePage_*> *
QArrayDataPointer<QueuePage_*>::allocateGrow
          (QArrayDataPointer<QueuePage_*> *__return_storage_ptr__,
          QArrayDataPointer<QueuePage_*> *from,qsizetype n,GrowthPosition position)

{
  Data *pDVar1;
  QueuePage **ppQVar2;
  long lVar3;
  long lVar4;
  Int IVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = from->d;
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar1->super_QArrayData).alloc;
  }
  lVar3 = from->size;
  if (lVar4 < lVar3) {
    lVar4 = lVar3;
  }
  if (position == GrowsAtEnd) {
    if (pDVar1 != (Data *)0x0) {
      lVar3 = (pDVar1->super_QArrayData).alloc -
              (lVar3 + ((long)((long)from->ptr -
                              ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) &
                              0xfffffffffffffff0)) >> 3));
      goto LAB_003d55a5;
    }
  }
  else if (pDVar1 != (Data *)0x0) {
    lVar3 = (long)((long)from->ptr -
                  ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3
    ;
    goto LAB_003d55a5;
  }
  lVar3 = 0;
LAB_003d55a5:
  lVar3 = (lVar4 + n) - lVar3;
  if (pDVar1 != (Data *)0x0) {
    lVar4 = (pDVar1->super_QArrayData).alloc;
    if (lVar4 <= lVar3) {
      lVar4 = lVar3;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar3 = lVar4;
    }
  }
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar1->super_QArrayData).alloc;
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar2 = (QueuePage **)QArrayData::allocate(&local_38,8,0x10,lVar3,(uint)(lVar3 <= lVar4));
  if (ppQVar2 != (QueuePage **)0x0 && local_38 != (QArrayData *)0x0) {
    if (position == GrowsAtBeginning) {
      lVar3 = (local_38->alloc - (from->size + n)) / 2;
      lVar4 = 0;
      if (0 < lVar3) {
        lVar4 = lVar3;
      }
      lVar4 = lVar4 + n;
    }
    else if (from->d == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (long)((long)from->ptr -
                    ((ulong)((long)&from->d[1].super_QArrayData.alloc + 7) & 0xfffffffffffffff0)) >>
              3;
    }
    if (from->d == (Data *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = (from->d->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    ppQVar2 = ppQVar2 + lVar4;
    (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
  }
  __return_storage_ptr__->d = (Data *)local_38;
  __return_storage_ptr__->ptr = ppQVar2;
  __return_storage_ptr__->size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }